

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

Mat * __thiscall ncnn::Mat::shape(Mat *__return_storage_ptr__,Mat *this)

{
  switch(this->dims) {
  case 1:
    Mat(__return_storage_ptr__,this->elempack * this->w,(void *)0x0,4,(Allocator *)0x0);
    break;
  case 2:
    Mat(__return_storage_ptr__,this->w,this->elempack * this->h,(void *)0x0,4,(Allocator *)0x0);
    break;
  case 3:
    Mat(__return_storage_ptr__,this->w,this->h,this->elempack * this->c,(void *)0x0,4,
        (Allocator *)0x0);
    break;
  case 4:
    Mat(__return_storage_ptr__,this->w,this->h,this->d,this->elempack * this->c,(void *)0x0,4,
        (Allocator *)0x0);
    break;
  default:
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::shape() const
{
    if (dims == 1)
        return Mat(w * elempack, (void*)0);
    if (dims == 2)
        return Mat(w, h * elempack, (void*)0);
    if (dims == 3)
        return Mat(w, h, c * elempack, (void*)0);
    if (dims == 4)
        return Mat(w, h, d, c * elempack, (void*)0);

    return Mat();
}